

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O0

bool __thiscall pg::TSPMSolver::canlift(TSPMSolver *this,int node,int pl)

{
  bool bVar1;
  int d_00;
  int iVar2;
  int *a;
  int local_50;
  int i;
  int to_1;
  int *curedge_1;
  int best_to;
  int to;
  int *curedge;
  int d;
  int *pm;
  int pl_local;
  int node_local;
  TSPMSolver *this_local;
  
  a = this->pms + this->k * (long)node;
  if (a[pl] == -1) {
    this_local._7_1_ = false;
  }
  else {
    d_00 = Solver::priority(&this->super_Solver,node);
    iVar2 = Solver::owner(&this->super_Solver,node);
    if (iVar2 == pl) {
      for (_best_to = Solver::outs(&this->super_Solver,node); *_best_to != -1;
          _best_to = _best_to + 1) {
        iVar2 = *_best_to;
        bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)iVar2);
        if (!bVar1) {
          Prog(this,this->tmp,this->pms + this->k * (long)iVar2,d_00,pl);
          bVar1 = pm_less(this,a,this->tmp,d_00,pl);
          if (bVar1) {
            return true;
          }
        }
      }
      this_local._7_1_ = false;
    }
    else {
      curedge_1._0_4_ = -1;
      for (_i = Solver::outs(&this->super_Solver,node); *_i != -1; _i = _i + 1) {
        iVar2 = *_i;
        bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)iVar2);
        if ((!bVar1) &&
           ((Prog(this,this->tmp,this->pms + this->k * (long)iVar2,d_00,pl), (int)curedge_1 == -1 ||
            (bVar1 = pm_less(this,this->tmp,this->best,d_00,pl), bVar1)))) {
          for (local_50 = 0; curedge_1._0_4_ = iVar2, (long)local_50 < this->k;
              local_50 = local_50 + 1) {
            this->best[local_50] = this->tmp[local_50];
          }
        }
      }
      if ((int)curedge_1 == -1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = pm_less(this,a,this->best,d_00,pl);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
TSPMSolver::canlift(int node, int pl)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top
    if (pm[pl] == -1) return false;

    const int d = priority(node);

    if (owner(node) == pl) {
        // do max
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl);
            if (pm_less(pm, tmp, d, pl)) return true;
        }
        return false;
    } else {
        // do min
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl);
            if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }
        if (best_to == -1) return false;
        return pm_less(pm, best, d, pl);
    }
}